

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(void)

{
  void *self;
  int64_t iVar1;
  char local_78 [8];
  char timebuf_2 [32];
  char timebuf_1 [32];
  char timebuf [32];
  void *map;
  
  self = rmlLinkedMapCreate();
  rmlLinkedMapPut(self,"age","30");
  rmlLinkedMapPut(self,"name","C Language");
  rmlLinkedMapPut(self,"gender","male");
  rml_get_current_local_time(timebuf_1 + 0x18,0x20);
  printf("[%s] %s(%d) [%s] ",timebuf_1 + 0x18,
         "/workspace/llm4binary/github/license_all_cmakelists_25/plter[P]rml/examples/test_linkedmap/main.c"
         ,0x15,"INFO");
  iVar1 = rmlLinkedMapGetLength(self);
  printf("Length: %lld",iVar1);
  printf("\n");
  rmlLinkedMapRemove(self,"age");
  rml_get_current_local_time(timebuf_2 + 0x18,0x20);
  printf("[%s] %s(%d) [%s] ",timebuf_2 + 0x18,
         "/workspace/llm4binary/github/license_all_cmakelists_25/plter[P]rml/examples/test_linkedmap/main.c"
         ,0x18,"INFO");
  iVar1 = rmlLinkedMapGetLength(self);
  printf("Length: %lld",iVar1);
  printf("\n");
  rmlLinkedMapRemove(self,"age");
  rml_get_current_local_time(local_78,0x20);
  printf("[%s] %s(%d) [%s] ",local_78,
         "/workspace/llm4binary/github/license_all_cmakelists_25/plter[P]rml/examples/test_linkedmap/main.c"
         ,0x1b,"INFO");
  iVar1 = rmlLinkedMapGetLength(self);
  printf("Length: %lld",iVar1);
  printf("\n");
  rmlLinkedMapEach(self,printValue,(void *)0x0);
  rmlLinkedMapDestroy(self);
  return 0;
}

Assistant:

int main() {

    void *map = rmlLinkedMapCreate();
    rmlLinkedMapPut(map, "age", "30");
    rmlLinkedMapPut(map, "name", "C Language");
    rmlLinkedMapPut(map, "gender", "male");
    RML_INFO("Length: %lld", rmlLinkedMapGetLength(map));

    rmlLinkedMapRemove(map, "age");
    RML_INFO("Length: %lld", rmlLinkedMapGetLength(map));

    rmlLinkedMapRemove(map, "age");
    RML_INFO("Length: %lld", rmlLinkedMapGetLength(map));

    rmlLinkedMapEach(map, &printValue, NULL);

    rmlLinkedMapDestroy(map);
    return 0;
}